

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::DriverVisitor,_true,_true>::visit<slang::ast::NullLiteral>
          (ASTVisitor<slang::ast::DriverVisitor,_true,_true> *this,NullLiteral *t)

{
  NullLiteral *t_local;
  ASTVisitor<slang::ast::DriverVisitor,_true,_true> *this_local;
  
  visitDefault<slang::ast::NullLiteral>(this,t);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (is_detected_v<handle_t, TDerived, T>)
            static_cast<TDerived*>(this)->handle(t);
        else if constexpr (is_detected_v<op_t, TDerived, T>)
            (DERIVED)(t);
        else
            visitDefault(t);
    }